

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

Tim_Man_t * Tim_ManDup(Tim_Man_t *p,int fUnitDelay)

{
  float fVar1;
  Tim_Obj_t *pTVar2;
  float *pfVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  Tim_Man_t *p_00;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar11;
  Vec_Ptr_t *pVVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  
  auVar5 = _DAT_008403e0;
  uVar14 = p->nCis;
  if ((0 < (int)uVar14) && (pTVar2 = p->pCis, pTVar2 != (Tim_Obj_t *)0x0)) {
    lVar10 = (ulong)uVar14 - 1;
    auVar16._8_4_ = (int)lVar10;
    auVar16._0_8_ = lVar10;
    auVar16._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar16 = auVar16 ^ _DAT_008403e0;
    auVar23 = _DAT_008403c0;
    auVar20 = _DAT_008403d0;
    do {
      auVar22 = auVar20 ^ auVar5;
      iVar18 = auVar16._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar18 && auVar16._0_4_ < auVar22._0_4_ ||
                  iVar18 < auVar22._4_4_) & 1)) {
        *(undefined4 *)((long)&pTVar2->TravId + lVar10) = 0;
      }
      if ((auVar22._12_4_ != auVar16._12_4_ || auVar22._8_4_ <= auVar16._8_4_) &&
          auVar22._12_4_ <= auVar16._12_4_) {
        *(undefined4 *)((long)&pTVar2[1].TravId + lVar10) = 0;
      }
      auVar22 = auVar23 ^ auVar5;
      iVar24 = auVar22._4_4_;
      if (iVar24 <= iVar18 && (iVar24 != iVar18 || auVar22._0_4_ <= auVar16._0_4_)) {
        *(undefined4 *)((long)&pTVar2[2].TravId + lVar10) = 0;
        *(undefined4 *)((long)&pTVar2[3].TravId + lVar10) = 0;
      }
      lVar19 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar19 + 4;
      lVar19 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar19 + 4;
      lVar10 = lVar10 + 0x60;
    } while ((ulong)(uVar14 + 3 >> 2) * 0x60 != lVar10);
  }
  auVar5 = _DAT_008403e0;
  uVar15 = p->nCos;
  if ((0 < (int)uVar15) && (pTVar2 = p->pCos, pTVar2 != (Tim_Obj_t *)0x0)) {
    lVar10 = (ulong)uVar15 - 1;
    auVar17._8_4_ = (int)lVar10;
    auVar17._0_8_ = lVar10;
    auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar17 = auVar17 ^ _DAT_008403e0;
    auVar22 = _DAT_008403c0;
    auVar21 = _DAT_008403d0;
    do {
      auVar23 = auVar21 ^ auVar5;
      iVar18 = auVar17._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar18 && auVar17._0_4_ < auVar23._0_4_ ||
                  iVar18 < auVar23._4_4_) & 1)) {
        *(undefined4 *)((long)&pTVar2->TravId + lVar10) = 0;
      }
      if ((auVar23._12_4_ != auVar17._12_4_ || auVar23._8_4_ <= auVar17._8_4_) &&
          auVar23._12_4_ <= auVar17._12_4_) {
        *(undefined4 *)((long)&pTVar2[1].TravId + lVar10) = 0;
      }
      auVar23 = auVar22 ^ auVar5;
      iVar24 = auVar23._4_4_;
      if (iVar24 <= iVar18 && (iVar24 != iVar18 || auVar23._0_4_ <= auVar17._0_4_)) {
        *(undefined4 *)((long)&pTVar2[2].TravId + lVar10) = 0;
        *(undefined4 *)((long)&pTVar2[3].TravId + lVar10) = 0;
      }
      lVar19 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar19 + 4;
      lVar19 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar19 + 4;
      lVar10 = lVar10 + 0x60;
    } while ((ulong)(uVar15 + 3 >> 2) * 0x60 != lVar10);
  }
  p_00 = Tim_ManStart(uVar14,uVar15);
  memcpy(p_00->pCis,p->pCis,(long)p->nCis * 0x18);
  memcpy(p_00->pCos,p->pCos,(long)p->nCos * 0x18);
  if (fUnitDelay != 0) {
    Tim_ManInitPiArrivalAll(p,0.0);
    Tim_ManInitPoRequiredAll(p,1e+09);
  }
  pVVar12 = p->vDelayTables;
  if (pVVar12 != (Vec_Ptr_t *)0x0) {
    uVar14 = pVVar12->nSize;
    uVar6 = (ulong)(int)uVar14;
    if (0 < (long)uVar6) {
      pVVar7 = (Vec_Ptr_t *)malloc(0x10);
      uVar13 = 8;
      if (8 < uVar14) {
        uVar13 = (ulong)uVar14;
      }
      pVVar7->nCap = (int)uVar13;
      ppvVar8 = (void **)malloc(uVar13 << 3);
      pVVar7->pArray = ppvVar8;
      pVVar7->nSize = uVar14;
      uVar13 = 0;
      memset(ppvVar8,0,uVar6 * 8);
      p_00->vDelayTables = pVVar7;
      do {
        pfVar3 = (float *)pVVar12->pArray[uVar13];
        if (pfVar3 != (float *)0x0) {
          fVar1 = *pfVar3;
          if (uVar13 != (uint)(int)fVar1) {
            __assert_fail("i == (int)pDelayTable[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                          ,0x7b,"Tim_Man_t *Tim_ManDup(Tim_Man_t *, int)");
          }
          uVar14 = (int)(float)((ulong)*(undefined8 *)(pfVar3 + 1) >> 0x20) *
                   (int)(float)*(undefined8 *)(pfVar3 + 1);
          pfVar9 = (float *)malloc((long)(int)uVar14 * 4 + 0xc);
          *pfVar9 = (float)(int)fVar1;
          pfVar9[1] = (float)(int)pfVar3[1];
          pfVar9[2] = (float)(int)pfVar3[2];
          if (0 < (int)uVar14) {
            uVar11 = 0;
            do {
              fVar1 = pfVar3[uVar11 + 3];
              if (fUnitDelay != 0) {
                fVar1 = (float)fUnitDelay;
              }
              uVar15 = -(uint)(pfVar3[uVar11 + 3] == -1e+09);
              pfVar9[uVar11 + 3] = (float)(uVar15 & 0xce6e6b28 | ~uVar15 & (uint)fVar1);
              uVar11 = uVar11 + 1;
            } while (uVar14 != uVar11);
          }
          if (uVar6 <= uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (pVVar7->pArray[uVar13] != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                          ,0x88,"Tim_Man_t *Tim_ManDup(Tim_Man_t *, int)");
          }
          pVVar7->pArray[uVar13] = pfVar9;
          pVVar12 = p->vDelayTables;
        }
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)pVVar12->nSize);
    }
  }
  pVVar12 = p->vBoxes;
  if ((pVVar12 != (Vec_Ptr_t *)0x0) && (uVar14 = pVVar12->nSize, 0 < (int)uVar14)) {
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    uVar6 = 8;
    if (8 < uVar14) {
      uVar6 = (ulong)uVar14;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = (int)uVar6;
    ppvVar8 = (void **)malloc(uVar6 << 3);
    pVVar7->pArray = ppvVar8;
    p_00->vBoxes = pVVar7;
    lVar10 = 0;
    do {
      pvVar4 = pVVar12->pArray[lVar10];
      Tim_ManCreateBox(p_00,*(int *)((long)pvVar4 + 0x1c),*(int *)((long)pvVar4 + 8),
                       *(int *)((long)pvVar4 + (long)*(int *)((long)pvVar4 + 8) * 4 + 0x1c),
                       *(int *)((long)pvVar4 + 0xc),*(int *)((long)pvVar4 + 0x10),
                       *(int *)((long)pvVar4 + 0x18));
      Tim_ManBoxSetCopy(p_00,(int)lVar10,*(int *)((long)pvVar4 + 0x14));
      lVar10 = lVar10 + 1;
      pVVar12 = p->vBoxes;
    } while (lVar10 < pVVar12->nSize);
  }
  return p_00;
}

Assistant:

Tim_Man_t * Tim_ManDup( Tim_Man_t * p, int fUnitDelay )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, nInputs, nOutputs;
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( p->nCis, p->nCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * p->nCis ); 
    memcpy( pNew->pCos, p->pCos, sizeof(Tim_Obj_t) * p->nCos ); 
    if ( fUnitDelay )
    {
        // discretize PI arrival times
//        Tim_ManForEachPi( pNew, pObj, k )
//          pObj->timeArr = (int)pObj->timeArr;
        // discretize PO required times
//        Tim_ManForEachPo( pNew, pObj, k )
//          pObj->timeReq = 1 + (int)pObj->timeReq;
        // clear PI arrival and PO required
        Tim_ManInitPiArrivalAll( p, 0.0 );
        Tim_ManInitPoRequiredAll( p, (float)TIM_ETERNITY );
    }
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = (int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
				if ( pDelayTable[3+k] == -ABC_INFINITY )
					pDelayTableNew[3+k] = -ABC_INFINITY;
				else
					pDelayTableNew[3+k] = fUnitDelay ? (float)fUnitDelay : pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
//printf( "Finished duplicating delay table %d.\n", i );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Tim_ManForEachBox( p, pBox, i )
        {
           Tim_ManCreateBox( pNew, pBox->Inouts[0], pBox->nInputs, 
                pBox->Inouts[pBox->nInputs], pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
           Tim_ManBoxSetCopy( pNew, i, pBox->iCopy );
        }
    }
    return pNew;
}